

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld_opts.c
# Opt level: O0

int set_field_opts(FIELD *field,Field_Options opts)

{
  int iVar1;
  int *piVar2;
  undefined8 local_20;
  int res;
  Field_Options opts_local;
  FIELD *field_local;
  
  local_20 = field;
  if (field == (FIELD *)0x0) {
    local_20 = _nc_Default_Field;
  }
  iVar1 = _nc_Synchronize_Options(local_20,opts & 0x3ff);
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  return iVar1;
}

Assistant:

int set_field_opts(FIELD * field, Field_Options opts)
{
  int res = E_BAD_ARGUMENT;
  opts &= ALL_FIELD_OPTS;
  if (!(opts & ~ALL_FIELD_OPTS))
    res = _nc_Synchronize_Options( Normalize_Field(field), opts );
  RETURN(res);
}